

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O2

void __thiscall
ContractInvariantTest_ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall_Test::
TestBody(ContractInvariantTest_ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall_Test
         *this)

{
  char *message;
  PreConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant> local_d8;
  PostConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant> local_c0;
  AssertionResult gtest_ar;
  TestClassMultipleConditionsAndInvariant local_80;
  Invariant<contract_light::v_100::contract_detail::ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>_>
  local_78;
  Invariant<contract_light::v_100::contract_detail::ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>_>
  local_60;
  PreConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant> local_48;
  
  local_80.invariantCalled = 0;
  local_d8.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  fileName = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
  ;
  local_d8.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  line = 0xfa;
  local_48.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  fileName = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
  ;
  local_48.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  line = 0xfb;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)anon_var_dwarf_3232;
  local_c0.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  fileName = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
  ;
  local_c0.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  line = 0xfd;
  local_60._context.fileName =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
  ;
  local_60._context.line = 0xfe;
  local_78._context.fileName =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
  ;
  local_78._context.line = 0xff;
  local_80._contract_light_contractor._invariantStack = 6;
  local_d8.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  provider = &local_80;
  local_c0.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  provider = &local_80;
  gtest_ar._0_8_ = &local_80;
  local_78._context.provider = &local_80;
  local_60._context.provider = &local_80;
  local_48.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  provider = &local_80;
  contract_light::v_100::contract_detail::
  Invariant<contract_light::v_100::contract_detail::ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>_>
  ::~Invariant(&local_78);
  contract_light::v_100::contract_detail::
  Invariant<contract_light::v_100::contract_detail::ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>_>
  ::~Invariant(&local_60);
  contract_light::v_100::contract_detail::InvariantPolicy::
  checkInvariant<contract_light::v_100::contract_detail::PostConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>const>
            (&local_c0);
  contract_light::v_100::contract_detail::InvariantPolicy::
  checkInvariant<contract_light::v_100::contract_detail::PostConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>const>
            ((PostConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant> *
             )&gtest_ar);
  contract_light::v_100::contract_detail::InvariantPolicy::
  checkInvariant<contract_light::v_100::contract_detail::PreConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>const>
            (&local_48);
  contract_light::v_100::contract_detail::InvariantPolicy::
  checkInvariant<contract_light::v_100::contract_detail::PreConditionContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>const>
            (&local_d8);
  local_c0.super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>.
  provider = (TestClassMultipleConditionsAndInvariant *)
             CONCAT44(local_c0.
                      super_ContractContext<(anonymous_namespace)::TestClassMultipleConditionsAndInvariant>
                      .provider._4_4_,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sut.invariantCalled",(int *)&local_c0,
             &local_80.invariantCalled);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x111,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ContractInvariantTest, ThatMultipleConditionsAndInvariantsResultOnlyInASingleInvariantCall)
{
  TestClassMultipleConditionsAndInvariant sut;
  sut.dummy1();
  EXPECT_EQ(1, sut.invariantCalled);

}